

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

void glibr(void)

{
  bool bVar1;
  obj *poVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  
  if ((uleft == (obj *)0x0) || ((uleft->field_0x4a & 1) != 0)) {
    bVar8 = false;
  }
  else {
    bVar8 = true;
    if (((uwep != (obj *)0x0) && (iVar3 = welded(uwep), iVar3 != 0)) &&
       ((byte)(uwep->oclass | 4U) == 6)) {
      bVar8 = (objects[uwep->otyp].field_0x11 & 1) == 0;
    }
  }
  bVar1 = false;
  if ((uright == (obj *)0x0) || ((uright->field_0x4a & 1) != 0)) {
    bVar9 = false;
  }
  else {
    iVar3 = welded(uwep);
    bVar9 = iVar3 == 0;
  }
  pcVar7 = "";
  if (((uarmg == (obj *)0x0) && (bVar8 || bVar9)) && ((~(youmonst.data)->mflags1 & 0x6000) != 0)) {
    pcVar7 = "ring slips";
    pcVar4 = body_part(3);
    if ((bool)(bVar8 & bVar9)) {
      pcVar7 = "rings slip";
      pcVar4 = makeplural(pcVar4);
    }
    pline("Your %s off your %s.",pcVar7,pcVar4);
    poVar2 = uleft;
    if (bVar8) {
      Ring_off_or_gone(uleft,'\0');
      dropx(poVar2);
    }
    poVar2 = uright;
    bVar1 = true;
    pcVar7 = "also ";
    if (bVar9) {
      Ring_off_or_gone(uright,'\0');
      dropx(poVar2);
    }
  }
  poVar2 = uswapwep;
  if (uswapwep == (obj *)0x0 || u.twoweap == '\0') {
    pcVar4 = (char *)0x0;
  }
  else {
    if (((long)uswapwep->oclass == 2) && ((byte)(objects[uswapwep->otyp].oc_subtyp - 5U) < 6)) {
      pcVar4 = "sword";
    }
    else {
      pcVar4 = makesingular(oclass_names[uswapwep->oclass]);
    }
    pcVar5 = body_part(6);
    pcVar5 = makeplural(pcVar5);
    pline("Your %s %sslips from your %s.",pcVar4,pcVar7,pcVar5);
    setuswapwep((obj *)0x0);
    if ((poVar2->otyp != 0x210) || (bVar1 = true, (poVar2->field_0x4a & 1) == 0)) {
      dropx(poVar2);
      bVar1 = true;
    }
  }
  poVar2 = uwep;
  if ((uwep != (obj *)0x0) && (iVar3 = welded(uwep), iVar3 == 0)) {
    if (((long)poVar2->oclass == 2) && ((byte)(objects[poVar2->otyp].oc_subtyp - 5U) < 6)) {
      pcVar7 = "sword";
    }
    else {
      pcVar7 = makesingular(oclass_names[poVar2->oclass]);
    }
    pcVar5 = "";
    if (pcVar4 != (char *)0x0) {
      iVar3 = strcmp(pcVar7,pcVar4);
      pcVar5 = "";
      if (iVar3 == 0) {
        pcVar5 = "other ";
      }
    }
    pcVar4 = "also ";
    if (!bVar1) {
      pcVar4 = "";
    }
    pcVar6 = body_part(6);
    pcVar6 = makeplural(pcVar6);
    pline("Your %s%s %sslips from your %s.",pcVar5,pcVar7,pcVar4,pcVar6);
    setuwep((obj *)0x0);
    if ((poVar2->otyp != 0x210) || ((poVar2->field_0x4a & 1) == 0)) {
      dropx(poVar2);
      return;
    }
  }
  return;
}

Assistant:

void glibr(void)
{
	struct obj *otmp;
	int xfl = 0;
	boolean leftfall, rightfall;
	const char *otherwep = 0;

	leftfall = (uleft && !uleft->cursed &&
		    (!uwep || !welded(uwep) || !bimanual(uwep)));
	rightfall = (uright && !uright->cursed && (!welded(uwep)));
	if (!uarmg && (leftfall || rightfall) && !nolimbs(youmonst.data)) {
		/* changed so cursed rings don't fall off, GAN 10/30/86 */
		pline("Your %s off your %s.",
			(leftfall && rightfall) ? "rings slip" : "ring slips",
			(leftfall && rightfall) ? makeplural(body_part(FINGER)) :
			body_part(FINGER));
		xfl++;
		if (leftfall) {
			otmp = uleft;
			Ring_off(uleft);
			dropx(otmp);
		}
		if (rightfall) {
			otmp = uright;
			Ring_off(uright);
			dropx(otmp);
		}
	}

	otmp = uswapwep;
	if (u.twoweap && otmp) {
		otherwep = is_sword(otmp) ? c_sword :
		    makesingular(oclass_names[(int)otmp->oclass]);
		pline("Your %s %sslips from your %s.",
			otherwep,
			xfl ? "also " : "",
			makeplural(body_part(HAND)));
		setuswapwep(NULL);
		xfl++;
		if (otmp->otyp != LOADSTONE || !otmp->cursed)
			dropx(otmp);
	}
	otmp = uwep;
	if (otmp && !welded(otmp)) {
		const char *thiswep;

		/* nice wording if both weapons are the same type */
		thiswep = is_sword(otmp) ? c_sword :
		    makesingular(oclass_names[(int)otmp->oclass]);
		if (otherwep && strcmp(thiswep, otherwep)) otherwep = 0;

		/* changed so cursed weapons don't fall, GAN 10/30/86 */
		pline("Your %s%s %sslips from your %s.",
			otherwep ? "other " : "", thiswep,
			xfl ? "also " : "",
			makeplural(body_part(HAND)));
		setuwep(NULL);
		if (otmp->otyp != LOADSTONE || !otmp->cursed)
			dropx(otmp);
	}
}